

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O3

void ON_NurbsSurface::ON_Internal_ConvertToCurve(ON_NurbsSurface *srf,int dir,ON_NurbsCurve *crv)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  double *pdVar4;
  uint uVar5;
  double *pdVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  
  ON_Curve::DestroyCurveTree(&crv->super_ON_Curve);
  bVar2 = dir != 0;
  iVar7 = (srf->m_dim + 1) - (uint)(srf->m_is_rat == 0);
  iVar1 = srf->m_cv_count[dir == 0];
  iVar8 = iVar7 * iVar1;
  uVar9 = (ulong)((uint)bVar2 * 4);
  iVar3 = ON_KnotCount(*(int *)((long)srf->m_order + uVar9),*(int *)((long)srf->m_cv_count + uVar9))
  ;
  crv->m_dim = iVar8;
  crv->m_is_rat = 0;
  crv->m_order = *(int *)((long)srf->m_order + uVar9);
  crv->m_cv_count = *(int *)((long)srf->m_cv_count + uVar9);
  crv->m_cv_stride = iVar8;
  ON_NurbsCurve::ReserveCVCapacity(crv,iVar8 * *(int *)((long)srf->m_cv_count + uVar9));
  iVar8 = ON_KnotCount(*(int *)((long)srf->m_order + uVar9),*(int *)((long)srf->m_cv_count + uVar9))
  ;
  ON_NurbsCurve::ReserveKnotCapacity(crv,iVar8);
  pdVar4 = srf->m_knot[bVar2];
  if (pdVar4 != (double *)0x0 && crv->m_knot != pdVar4) {
    memcpy(crv->m_knot,pdVar4,(long)iVar3 << 3);
  }
  if (srf->m_cv != (double *)0x0 && crv->m_cv != srf->m_cv) {
    if (dir == 0) {
      if (0 < crv->m_cv_count) {
        iVar3 = 0;
        do {
          pdVar4 = ON_NurbsCurve::CV(crv,iVar3);
          if (0 < iVar1) {
            iVar8 = 0;
            do {
              uVar5 = srf->m_cv_stride[1] * iVar8 + srf->m_cv_stride[0] * iVar3;
              pdVar6 = srf->m_cv + uVar5;
              if ((int)uVar5 < 0) {
                pdVar6 = (double *)0x0;
              }
              if (srf->m_cv == (double *)0x0) {
                pdVar6 = (double *)0x0;
              }
              memcpy(pdVar4,pdVar6,(long)iVar7 * 8);
              iVar8 = iVar8 + 1;
              pdVar4 = pdVar4 + iVar7;
            } while (iVar1 != iVar8);
          }
          iVar3 = iVar3 + 1;
        } while (iVar3 < crv->m_cv_count);
      }
    }
    else if (0 < crv->m_cv_count) {
      iVar3 = 0;
      do {
        pdVar4 = ON_NurbsCurve::CV(crv,iVar3);
        if (0 < iVar1) {
          iVar8 = 0;
          do {
            uVar5 = srf->m_cv_stride[1] * iVar3 + srf->m_cv_stride[0] * iVar8;
            pdVar6 = srf->m_cv + uVar5;
            if ((int)uVar5 < 0) {
              pdVar6 = (double *)0x0;
            }
            if (srf->m_cv == (double *)0x0) {
              pdVar6 = (double *)0x0;
            }
            memcpy(pdVar4,pdVar6,(long)iVar7 * 8);
            iVar8 = iVar8 + 1;
            pdVar4 = pdVar4 + iVar7;
          } while (iVar1 != iVar8);
        }
        iVar3 = iVar3 + 1;
      } while (iVar3 < crv->m_cv_count);
    }
  }
  return;
}

Assistant:

void ON_NurbsSurface::ON_Internal_ConvertToCurve(const ON_NurbsSurface& srf,
                                                 int dir, ON_NurbsCurve& crv) {
  crv.DestroyCurveTree();
  if (dir)
    dir = 1;
  const int Sdim = srf.CVSize();
  const int n = srf.CVCount(1-dir);
  const int Ndim = Sdim*n;
  const int knot_count = srf.KnotCount(dir);
  int i, j;
  double *Ncv;
  const double *Scv;

  crv.m_dim = Ndim;
  crv.m_is_rat = 0;
  crv.m_order = srf.Order(dir);
  crv.m_cv_count = srf.CVCount(dir);
  crv.m_cv_stride = crv.m_dim;
  crv.ReserveCVCapacity(srf.CVCount(dir)*Ndim);
  crv.ReserveKnotCapacity(srf.KnotCount(dir));

  if ( crv.m_knot != srf.m_knot[dir] && srf.m_knot[dir] ) 
  {
    memcpy( crv.m_knot, srf.m_knot[dir], knot_count*sizeof(crv.m_knot[0]) );
  }

  if ( crv.m_cv != srf.m_cv && srf.m_cv ) 
  {
    if (dir) {
      for ( i = 0; i < crv.m_cv_count; i++ ) {
        Ncv = crv.CV(i);
        for ( j = 0; j < n; j++ ) {
          Scv = srf.CV(j,i);
          memcpy( Ncv, Scv, Sdim*sizeof(*Ncv) );
          Ncv += Sdim;
        }
      }
    }
    else {
      for ( i = 0; i < crv.m_cv_count; i++ ) {
        Ncv = crv.CV(i);
        for ( j = 0; j < n; j++ ) {
          Scv = srf.CV(i,j);
          memcpy( Ncv, Scv, Sdim*sizeof(*Ncv) );
          Ncv += Sdim;
        }
      }
    }
  }
}